

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

double getStepLength(Mesh *mesh,VectorXd *params,VectorXd *p,VectorXd *grad,double *epsilon,
                    double alpha0)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  Scalar SVar6;
  double dVar7;
  bool bVar8;
  ostream *poVar9;
  double *pdVar10;
  VectorXd *pVVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 in_XMM0_Dc;
  undefined4 uVar15;
  undefined4 in_XMM0_Dd;
  undefined4 uVar16;
  double dVar17;
  scalar_sum_op<double,_double> local_d9;
  undefined1 local_d8 [16];
  double local_c0;
  double *local_b8;
  double local_b0;
  XprType local_a8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_88;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_d8._8_4_ = in_XMM0_Dc;
  local_d8._0_8_ = alpha0;
  local_d8._12_4_ = in_XMM0_Dd;
  local_b8 = epsilon;
  local_50 = getEnergy(mesh,params,*epsilon,false);
  local_88.m_evaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  ._0_8_ = (double *)0x0;
  local_88.m_evaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
       (double *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_88,
             (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,1)
  ;
  pdVar4 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  pdVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar10 = (double *)
            (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (local_88.m_evaluator.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data !=
      pdVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_88,(Index)pdVar10,
               1);
  }
  pdVar10 = (double *)
            ((long)local_88.m_evaluator.
                   super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   .m_data -
             ((long)local_88.m_evaluator.
                    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                    .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    .m_data >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)local_88.m_evaluator.
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_data) {
    lVar12 = 0;
    do {
      pdVar2 = pdVar5 + lVar12;
      dVar7 = pdVar2[1];
      pdVar3 = pdVar4 + lVar12;
      dVar17 = pdVar3[1];
      *(double *)
       (local_88.m_evaluator.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        ._0_8_ + lVar12 * 8) = *pdVar2 * (double)local_d8._0_8_ + *pdVar3;
      ((double *)
      (local_88.m_evaluator.
       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
       ._0_8_ + lVar12 * 8))[1] = dVar7 * (double)local_d8._0_8_ + dVar17;
      lVar12 = lVar12 + 2;
    } while (lVar12 < (long)pdVar10);
  }
  if ((long)pdVar10 <
      (long)local_88.m_evaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data
     ) {
    do {
      *(double *)
       (local_88.m_evaluator.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        ._0_8_ + pdVar10 * 8) =
           pdVar5[(long)pdVar10] * (double)local_d8._0_8_ + pdVar4[(long)pdVar10];
      pdVar10 = (double *)((long)pdVar10 + 1);
    } while (local_88.m_evaluator.
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
             m_data != pdVar10);
  }
  local_b0 = getEnergy(mesh,(VectorXd *)&local_88,*local_b8,false);
  free((void *)local_88.m_evaluator.
               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
               ._0_8_);
  local_a8.m_lhs = p;
  local_a8.m_rhs = grad;
  if ((grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0)
  {
    uVar13 = 0;
    uVar14 = 0;
  }
  else {
    local_88.m_evaluator.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
         (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_88.m_evaluator.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
         (grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_88.m_xpr = &local_a8;
    SVar6 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
            ::run(&local_88,&local_d9);
    uVar13 = SUB84(SVar6,0);
    uVar14 = (undefined4)((ulong)SVar6 >> 0x20);
  }
  local_c0 = (double)CONCAT44(uVar14,uVar13);
  while( true ) {
    dVar17 = (double)CONCAT44(local_d8._4_4_,local_d8._0_4_) * 0.0001 * local_c0 + local_50;
    bVar8 = true;
    uVar13 = local_d8._0_4_;
    uVar14 = local_d8._4_4_;
    uVar15 = local_d8._8_4_;
    uVar16 = local_d8._12_4_;
    if (local_b0 <= dVar17) {
      local_88.m_evaluator.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      ._0_8_ = (double *)0x0;
      local_88.m_evaluator.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
           (double *)0x0;
      local_48 = dVar17;
      uStack_40 = CONCAT44(local_d8._12_4_,local_d8._8_4_);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_88,
                 (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,1);
      pdVar4 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar10 = (double *)
                (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      if (local_88.m_evaluator.
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data
          != pdVar10) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_88,
                   (Index)pdVar10,1);
      }
      pdVar10 = (double *)
                ((long)local_88.m_evaluator.
                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                       .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       .m_data -
                 ((long)local_88.m_evaluator.
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        .m_data >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)local_88.m_evaluator.
                    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                    .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    .m_data) {
        lVar12 = 0;
        do {
          pdVar2 = pdVar5 + lVar12;
          dVar7 = pdVar2[1];
          pdVar3 = pdVar4 + lVar12;
          dVar17 = pdVar3[1];
          *(double *)
           (local_88.m_evaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            ._0_8_ + lVar12 * 8) = *pdVar2 * (double)local_d8._0_8_ + *pdVar3;
          ((double *)
          (local_88.m_evaluator.
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           ._0_8_ + lVar12 * 8))[1] = dVar7 * (double)local_d8._0_8_ + dVar17;
          lVar12 = lVar12 + 2;
        } while (lVar12 < (long)pdVar10);
      }
      if ((long)pdVar10 <
          (long)local_88.m_evaluator.
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_data) {
        do {
          *(double *)
           (local_88.m_evaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            ._0_8_ + pdVar10 * 8) =
               pdVar5[(long)pdVar10] * (double)local_d8._0_8_ + pdVar4[(long)pdVar10];
          pdVar10 = (double *)((long)pdVar10 + 1);
        } while (local_88.m_evaluator.
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                 m_data != pdVar10);
      }
      bVar8 = checkCreterion(mesh,(VectorXd *)&local_88,*local_b8);
      bVar8 = !bVar8;
      uVar13 = local_d8._0_4_;
      uVar14 = local_d8._4_4_;
      uVar15 = local_d8._8_4_;
      uVar16 = local_d8._12_4_;
      dVar17 = local_48;
    }
    if (local_b0 <= dVar17) {
      free((void *)local_88.m_evaluator.
                   super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   ._0_8_);
      uVar13 = local_d8._0_4_;
      uVar14 = local_d8._4_4_;
      uVar15 = local_d8._8_4_;
      uVar16 = local_d8._12_4_;
    }
    if (!bVar8) break;
    local_d8._8_4_ = uVar15;
    local_d8._0_8_ = (double)CONCAT44(uVar14,uVar13) * 0.5;
    local_d8._12_4_ = uVar16;
    local_a8.m_lhs = (VectorXd *)0x0;
    local_a8.m_rhs = (VectorXd *)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8,
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               1);
    pdVar4 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pVVar11 = (VectorXd *)
              (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (local_a8.m_rhs != pVVar11) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8,
                 (Index)pVVar11,1);
    }
    pVVar11 = (VectorXd *)
              ((long)local_a8.m_rhs - ((long)local_a8.m_rhs >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)local_a8.m_rhs) {
      lVar12 = 0;
      do {
        pdVar10 = pdVar5 + lVar12;
        dVar7 = pdVar10[1];
        pdVar2 = pdVar4 + lVar12;
        dVar17 = pdVar2[1];
        ppdVar1 = &((local_a8.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_data + lVar12;
        *ppdVar1 = (double *)(*pdVar10 * (double)local_d8._0_8_ + *pdVar2);
        ppdVar1[1] = (double *)(dVar7 * (double)local_d8._0_8_ + dVar17);
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)pVVar11);
    }
    if ((long)pVVar11 < (long)local_a8.m_rhs) {
      do {
        (&((local_a8.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
          m_storage.m_data)[(long)pVVar11] =
             (double *)(pdVar5[(long)pVVar11] * (double)local_d8._0_8_ + pdVar4[(long)pVVar11]);
        pVVar11 = (VectorXd *)
                  ((long)&(pVVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + 1);
      } while (local_a8.m_rhs != pVVar11);
    }
    local_b0 = getEnergy(mesh,(VectorXd *)&local_a8,*local_b8,false);
    free(local_a8.m_lhs);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Step len: ",10);
  poVar9 = std::ostream::_M_insert<double>((double)local_d8._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," dphi: ",7);
  poVar9 = std::ostream::_M_insert<double>(local_c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return (double)local_d8._0_8_;
}

Assistant:

double getStepLength(const Mesh& mesh, const Eigen::VectorXd& params, const Eigen::VectorXd& p, const Eigen::VectorXd& grad, const double& epsilon, double alpha0) {
    constexpr double c1 = 1e-4;
    double ene0 = getEnergy(mesh, params, epsilon);
    double enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    double dphi = p.dot(grad);
    while (enei > ene0 + c1 * alpha0 * dphi || !checkCreterion(mesh, params + alpha0 * p, epsilon)) {
        alpha0 *= 0.50;
        enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    }

#ifdef TEST
    std::cout << "Step len: " << alpha0 << " dphi: " << dphi << std::endl;
#endif
    return alpha0;
}